

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O3

BSSRDFSample * __thiscall
pbrt::TabulatedBSSRDF::ProbeIntersectionToSample
          (BSSRDFSample *__return_storage_ptr__,TabulatedBSSRDF *this,SubsurfaceInteraction *si,
          NormalizedFresnelBxDF *bxdf)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  BSDF bsdf;
  BxDFHandle local_90;
  Tuple3<pbrt::Point3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  BSDF local_68;
  
  bxdf->eta = this->eta;
  local_78.z = (si->ns).super_Tuple3<pbrt::Normal3,_float>.z;
  local_78.x = (si->ns).super_Tuple3<pbrt::Normal3,_float>.x;
  local_78.y = (si->ns).super_Tuple3<pbrt::Normal3,_float>.y;
  local_90.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)bxdf | 0xa000000000000);
  BSDF::BSDF(&local_68,(Vector3f *)&local_78,&si->n,&si->ns,&si->dpdus,&local_90);
  fVar2 = (this->po).super_Tuple3<pbrt::Point3,_float>.x -
          ((si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
          (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
          0.5;
  fVar3 = (this->po).super_Tuple3<pbrt::Point3,_float>.y -
          ((si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
          (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
          0.5;
  fVar4 = (this->po).super_Tuple3<pbrt::Point3,_float>.z -
          ((si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          0.5;
  auVar12 = (undefined1  [56])0x0;
  auVar6 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  auVar10 = ZEXT856(auVar6._8_8_);
  SVar13 = Sr(this,auVar6._0_4_);
  auVar11._0_8_ = SVar13.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar9._0_8_ = SVar13.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  auVar6 = vmovlhps_avx(auVar9._0_16_,auVar11._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->Sp).values.values = auVar6;
  auVar6._0_4_ = (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 low;
  auVar6._4_4_ = (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high;
  auVar6._8_4_ = (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low;
  auVar6._12_4_ =
       (si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar1 = *(undefined8 *)
           &(si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(si->pi).super_Point3<pbrt::Interval>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                         0x10);
  auVar8._0_4_ = (float)uVar1 + auVar6._0_4_;
  auVar8._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar6._4_4_;
  auVar8._8_4_ = auVar6._8_4_ + 0.0;
  auVar8._12_4_ = auVar6._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar6 = vmulps_avx512vl(auVar8,auVar5);
  local_88.z = ((si->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + (si->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  local_88._0_8_ = vmovlps_avx(auVar6);
  FVar7 = PDF_Sp(this,(Point3f *)&local_88,&si->n);
  __return_storage_ptr__->pdf = FVar7;
  (__return_storage_ptr__->Sw).bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (uintptr_t)
          local_68.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame._20_8_;
  (__return_storage_ptr__->Sw).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.x =
       local_68.ng.super_Tuple3<pbrt::Normal3,_float>.x;
  (__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.y =
       local_68.ng.super_Tuple3<pbrt::Normal3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.z =
       local_68._16_8_;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = local_78.x;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y = local_78.y;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = local_78.z;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSSRDFSample ProbeIntersectionToSample(const SubsurfaceInteraction &si,
                                           NormalizedFresnelBxDF *bxdf) const {
        *bxdf = NormalizedFresnelBxDF(eta);
        Vector3f wo = Vector3f(si.ns);
        BSDF bsdf(wo, si.n, si.ns, si.dpdus, bxdf);
        return BSSRDFSample{Sp(si.p()), PDF_Sp(si.p(), si.n), bsdf, wo};
    }